

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O0

void HydroUtils::ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,int ncomp,Geometry *geom,Real mult,
               bool fluxes_are_area_weighted)

{
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_R8;
  double in_XMM0_Qa;
  CoordSys *in_stack_00000008;
  byte in_stack_00000010;
  Real qvol;
  Real fact_z;
  Real fact_y;
  Real fact_x;
  GpuArray<double,_3U> dxinv;
  undefined1 local_1f0 [56];
  anon_class_280_7_d21a4551 *in_stack_fffffffffffffe48;
  double dVar1;
  int ncomp_00;
  Box *in_stack_fffffffffffffe58;
  undefined1 auStack_160 [64];
  double local_120;
  undefined1 auStack_118 [64];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  GpuArray<double,_3U> local_b8;
  byte local_99;
  double local_98;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  undefined4 local_5c;
  GpuArray<double,_3U> *local_58;
  undefined4 local_4c;
  GpuArray<double,_3U> *local_48;
  undefined4 local_3c;
  GpuArray<double,_3U> *local_38;
  undefined4 local_2c;
  GpuArray<double,_3U> *local_28;
  undefined4 local_1c;
  GpuArray<double,_3U> *local_18;
  undefined4 local_c;
  GpuArray<double,_3U> *local_8;
  
  local_99 = in_stack_00000010 & 1;
  local_98 = in_XMM0_Qa;
  local_88 = in_R8;
  local_80 = in_RCX;
  local_78 = in_RDX;
  local_70 = in_RSI;
  amrex::CoordSys::InvCellSizeArray(&local_b8,in_stack_00000008);
  if ((local_99 & 1) == 0) {
    local_38 = &local_b8;
    local_3c = 0;
    local_48 = &local_b8;
    local_4c = 1;
    local_58 = &local_b8;
    local_5c = 2;
  }
  else {
    local_8 = &local_b8;
    local_c = 0;
    local_18 = &local_b8;
    local_1c = 1;
    local_28 = &local_b8;
    local_2c = 2;
    local_d8 = local_b8.arr[0] * local_b8.arr[1] * local_b8.arr[2];
    local_b8.arr[2] = local_d8;
    local_b8.arr[1] = local_d8;
    local_b8.arr[0] = local_d8;
  }
  local_c0 = local_b8.arr[0] * local_98;
  local_c8 = local_b8.arr[1] * local_98;
  local_d0 = local_b8.arr[2] * local_98;
  memcpy(local_1f0,local_70,0x3c);
  dVar1 = local_c0;
  memcpy(&stack0xfffffffffffffe58,local_78,0x3c);
  ncomp_00 = (int)((ulong)dVar1 >> 0x20);
  memcpy(auStack_160,local_80,0x3c);
  local_120 = local_d0;
  memcpy(auStack_118,local_88,0x3c);
  amrex::
  ParallelFor<int,HydroUtils::ComputeDivergence(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,int,amrex::Geometry_const&,double,bool)::__0,void>
            (in_stack_fffffffffffffe58,ncomp_00,in_stack_fffffffffffffe48);
  return;
}

Assistant:

void
HydroUtils::ComputeDivergence ( Box const& bx,
                                Array4<Real> const& div,
                                AMREX_D_DECL( Array4<Real const> const& fx,
                                              Array4<Real const> const& fy,
                                              Array4<Real const> const& fz),
                                const int ncomp, Geometry const& geom,
                                const Real mult,
                                const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        const int ngrow_metric = 0;
        FArrayBox vol_fab;
        geom.GetVolume(vol_fab,BoxArray(bx),0,ngrow_metric);
        Elixir vol_eli = vol_fab.elixir();
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (!fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_metric);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& vol = vol_fab.const_array();
        const auto& ax  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                     : area[0].const_array();
        const auto& ay  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                      : area[1].const_array();
        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                div(i,j,k,n) = ( fx(i+1,j,k,n) -  fx(i,j,k,n) +
                                 fy(i,j+1,k,n) -  fy(i,j,k,n) ) * mult / vol(i,j,k);
            } else {
                div(i,j,k,n) = ( ax(i+1,j,k)*fx(i+1,j,k,n) -  ax(i,j,k)*fx(i,j,k,n) +
                                 ay(i,j+1,k)*fy(i,j+1,k,n) -  ay(i,j,k)*fy(i,j,k,n) ) * mult / vol(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dxinv = geom.InvCellSizeArray();
        AMREX_D_TERM(Real fact_x = mult;,
                     Real fact_y = mult;,
                     Real fact_z = mult;);

        if (fluxes_are_area_weighted) {
            Real qvol = AMREX_D_TERM(dxinv[0],*dxinv[1],*dxinv[2]);

            AMREX_D_TERM(fact_x *= qvol;,
                         fact_y *= qvol;,
                         fact_z *= qvol;);
        } else {
            AMREX_D_TERM(fact_x *= dxinv[0];,
                         fact_y *= dxinv[1];,
                         fact_z *= dxinv[2];);
        }

        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            div(i,j,k,n) = AMREX_D_TERM(  fact_x * ( fx(i+1,j,k,n) - fx(i,j,k,n) ),
                                        + fact_y * ( fy(i,j+1,k,n) - fy(i,j,k,n) ),
                                        + fact_z * ( fz(i,j,k+1,n) - fz(i,j,k,n) ));
        });
    }